

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

bool __thiscall
Fossilize::StreamArchive::find_entry(StreamArchive *this,ResourceTag tag,Hash hash,Entry *entry)

{
  bool bVar1;
  pointer pvVar2;
  _Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_false>
  local_40;
  _Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_false>
  local_38;
  const_iterator itr;
  Entry *entry_local;
  Hash hash_local;
  StreamArchive *pSStack_18;
  ResourceTag tag_local;
  StreamArchive *this_local;
  
  itr.
  super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_false>.
  _M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_false>
            )(_Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_false>
              )entry;
  entry_local = (Entry *)hash;
  hash_local._4_4_ = tag;
  pSStack_18 = this;
  if (this->imported_metadata == (ExportedMetadataHeader *)0x0) {
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_Fossilize::StreamArchive::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>_>_>
         ::find(this->seen_blobs + tag,(key_type *)&entry_local);
    local_40._M_cur =
         (__node_type *)
         std::
         end<std::unordered_map<unsigned_long,Fossilize::StreamArchive::Entry,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Fossilize::StreamArchive::Entry>>>>
                   (this->seen_blobs + hash_local._4_4_);
    bVar1 = std::__detail::operator==(&local_38,&local_40);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      pvVar2 = std::__detail::
               _Node_const_iterator<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_false,_false>
               ::operator->((_Node_const_iterator<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_false,_false>
                             *)&local_38);
      *(uint64_t *)
       itr.
       super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_false>
       ._M_cur = (pvVar2->second).offset;
      *(undefined8 *)
       ((long)itr.
              super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_false>
              ._M_cur + 8) = *(undefined8 *)&(pvVar2->second).header;
      *(undefined8 *)
       ((long)itr.
              super__Node_iterator_base<std::pair<const_unsigned_long,_Fossilize::StreamArchive::Entry>,_false>
              ._M_cur + 0x10) = *(undefined8 *)&(pvVar2->second).header.crc;
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = find_entry_from_metadata(this->imported_metadata,tag,hash,entry);
  }
  return this_local._7_1_;
}

Assistant:

bool find_entry(ResourceTag tag, Hash hash, Entry &entry) const
	{
		if (imported_metadata)
		{
			return find_entry_from_metadata(imported_metadata, tag, hash, &entry);
		}
		else
		{
			auto itr = seen_blobs[tag].find(hash);
			if (itr == end(seen_blobs[tag]))
				return false;

			entry = itr->second;
			return true;
		}
	}